

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O3

BOOL __thiscall
Js::DynamicObject::CallToPrimitiveFunction
          (DynamicObject *this,Var toPrimitiveFunction,PropertyId propertyId,Var *result,
          ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  Type TVar2;
  ThreadContext *this_00;
  code *pcVar3;
  bool bVar4;
  Attributes attributes;
  BOOL BVar5;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  RecyclableObject *this_01;
  Var *ppvVar8;
  anon_class_24_3_4fd9d492 local_58;
  Var *local_40;
  bool local_31;
  
  bVar4 = JavascriptConversion::IsCallable(toPrimitiveFunction);
  if (!bVar4) {
    return 0;
  }
  local_40 = result;
  pRVar6 = VarTo<Js::RecyclableObject>(toPrimitiveFunction);
  this_00 = requestContext->threadContext;
  local_31 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  local_58.this = this;
  local_58.threadContext = this_00;
  local_58.toStringFunction = pRVar6;
  attributes = FunctionInfo::GetAttributes(pRVar6);
  bVar4 = ThreadContext::HasNoSideEffect(this_00,pRVar6,attributes);
  if (bVar4) {
    pRVar6 = (RecyclableObject *)
             CallToPrimitiveFunction::anon_class_24_3_4fd9d492::operator()(&local_58);
    bVar4 = ThreadContext::IsOnStack(pRVar6);
LAB_00db26b9:
    if (bVar4 != false) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_ToPrimitive;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      pRVar6 = (RecyclableObject *)
               CallToPrimitiveFunction::anon_class_24_3_4fd9d492::operator()(&local_58);
      bVar4 = ThreadContext::IsOnStack(pRVar6);
      goto LAB_00db26b9;
    }
    IVar1 = this_00->implicitCallFlags;
    pRVar6 = (RecyclableObject *)
             CallToPrimitiveFunction::anon_class_24_3_4fd9d492::operator()(&local_58);
    this_00->implicitCallFlags = IVar1 | ImplicitCall_ToPrimitive;
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_ToPrimitive;
    pRVar6 = (((((((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  ppvVar8 = local_40;
  this_00->reentrancySafeOrHandled = local_31;
  if (pRVar6 == (RecyclableObject *)0x0) {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x1d6,"(threadContext->IsDisableImplicitCall())",
                                  "threadContext->IsDisableImplicitCall()");
      if (!bVar4) goto LAB_00db296a;
      *puVar7 = 0;
    }
    *ppvVar8 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).nullValue.ptr;
  }
  else {
    if (((ulong)pRVar6 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pRVar6 & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)pRVar6 >> 0x32 == 0 && ((ulong)pRVar6 & 0xffff000000000000) != 0x1000000000000) {
        this_01 = UnsafeVarTo<Js::RecyclableObject>(pRVar6);
        if (this_01 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_00db296a;
          *puVar7 = 0;
        }
        TVar2 = ((this_01->type).ptr)->typeId;
        if (0x57 < (int)TVar2) {
          BVar5 = RecyclableObject::IsExternal(this_01);
          if (BVar5 != 0) {
            return 0;
          }
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (bVar4) {
            *puVar7 = 0;
            return 0;
          }
          goto LAB_00db296a;
        }
        if (9 < (int)TVar2) {
          return 0;
        }
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) {
LAB_00db296a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
      ppvVar8 = local_40;
    }
    *ppvVar8 = pRVar6;
  }
  return 1;
}

Assistant:

BOOL DynamicObject::CallToPrimitiveFunction(Var toPrimitiveFunction, PropertyId propertyId, Var* result, ScriptContext * requestContext)
    {
        if (JavascriptConversion::IsCallable(toPrimitiveFunction))
        {
            RecyclableObject* toStringFunction = VarTo<RecyclableObject>(toPrimitiveFunction);

            ThreadContext * threadContext = requestContext->GetThreadContext();
            Var aResult = threadContext->ExecuteImplicitCall(toStringFunction, ImplicitCall_ToPrimitive, [=]() -> Js::Var
            {
                // Stack object should have a pre-op bail on implicit call.  We shouldn't see them here.
                Assert(!ThreadContext::IsOnStack(this) || threadContext->HasNoSideEffect(toStringFunction));
                return CALL_FUNCTION(threadContext, toStringFunction, CallInfo(CallFlags_Value, 1), this);
            });

            if (!aResult)
            {
                // There was an implicit call and implicit calls are disabled. This would typically cause a bailout.
                Assert(threadContext->IsDisableImplicitCall());
                *result = requestContext->GetLibrary()->GetNull();
                return true;
            }

            if (JavascriptOperators::GetTypeId(aResult) <= TypeIds_LastToPrimitiveType)
            {
                *result = aResult;
                return true;
            }
        }
        return false;
    }